

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resource.cpp
# Opt level: O0

void Corrade::Utility::Resource::overrideGroup(StringView group,StringView configurationFile)

{
  StringView value;
  map<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::String,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
  *this;
  int iVar1;
  ResourceGroup *pRVar2;
  ostream *output;
  Debug *pDVar3;
  pointer ppVar4;
  char *pcVar5;
  String *pSVar6;
  String *extraout_RDX;
  String *extraout_RDX_00;
  pair<std::_Rb_tree_iterator<std::pair<const_Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::String>_>,_bool>
  pVar7;
  StringView view;
  StringView name;
  String local_e0;
  _Rb_tree_iterator<std::pair<const_Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::String>_>
  local_c8;
  undefined1 local_c0;
  String *local_b8;
  char *pcStack_b0;
  String local_a0;
  size_t local_88;
  char *pcStack_80;
  Flags local_61;
  Error local_60;
  size_t local_38;
  char *local_30;
  String *pSStack_28;
  StringView configurationFile_local;
  StringView group_local;
  
  pcVar5 = (char *)configurationFile._sizePlusFlags;
  pSVar6 = (String *)configurationFile._data;
  name._data = (char *)group._sizePlusFlags;
  configurationFile_local._sizePlusFlags = (size_t)group._data;
  pSStack_28 = pSVar6;
  configurationFile_local._data = pcVar5;
  if ((map<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::String,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
       *)DAT_001f2348 ==
      (map<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::String,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
       *)0x0) {
    if (overrideGroup(Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>)
        ::overrideGroups == '\0') {
      iVar1 = __cxa_guard_acquire(&overrideGroup(Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>)
                                   ::overrideGroups);
      pSVar6 = extraout_RDX;
      if (iVar1 != 0) {
        std::
        map<Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::String,_std::less<Corrade::Containers::BasicStringView<const_char>_>,_std::allocator<std::pair<const_Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::String>_>_>
        ::map(&overrideGroup::overrideGroups);
        __cxa_atexit(std::
                     map<Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::String,_std::less<Corrade::Containers::BasicStringView<const_char>_>,_std::allocator<std::pair<const_Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::String>_>_>
                     ::~map,&overrideGroup::overrideGroups,&__dso_handle);
        __cxa_guard_release(&overrideGroup(Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>)
                             ::overrideGroups);
        pSVar6 = extraout_RDX_00;
      }
    }
    DAT_001f2348 = &overrideGroup::overrideGroups;
  }
  local_38 = configurationFile_local._sizePlusFlags;
  name._sizePlusFlags = (size_t)pSVar6;
  local_30 = name._data;
  pRVar2 = anon_unknown_3::findGroup((anon_unknown_3 *)configurationFile_local._sizePlusFlags,name);
  if (pRVar2 == (ResourceGroup *)0x0) {
    output = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_61);
    Error::Error(&local_60,output,local_61);
    pDVar3 = Debug::operator<<(&local_60.super_Debug,"Utility::Resource::overrideGroup(): group \'")
    ;
    pDVar3 = Debug::operator<<(pDVar3,Debug::nospace);
    local_88 = configurationFile_local._sizePlusFlags;
    value._sizePlusFlags = (size_t)name._data;
    value._data = (char *)configurationFile_local._sizePlusFlags;
    pcStack_80 = name._data;
    pDVar3 = Debug::operator<<(pDVar3,value);
    pDVar3 = Debug::operator<<(pDVar3,Debug::nospace);
    Debug::operator<<(pDVar3,"\' was not found");
    Error::~Error(&local_60);
    abort();
  }
  local_b8 = pSStack_28;
  pcStack_b0 = configurationFile_local._data;
  view._sizePlusFlags = (size_t)pcVar5;
  view._data = configurationFile_local._data;
  Containers::String::nullTerminatedGlobalView(&local_a0,pSStack_28,view);
  this = (map<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::String,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
          *)DAT_001f2348;
  Containers::String::String(&local_e0);
  pVar7 = std::
          map<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::String,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
          ::
          emplace<Corrade::Containers::BasicStringView<char_const>const&,Corrade::Containers::String>
                    (this,(BasicStringView<const_char> *)&configurationFile_local._sizePlusFlags,
                     &local_e0);
  local_c8 = pVar7.first._M_node;
  local_c0 = pVar7.second;
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::String>_>
           ::operator->(&local_c8);
  Containers::String::operator=(&ppVar4->second,&local_a0);
  Containers::String::~String(&local_e0);
  Containers::String::~String(&local_a0);
  return;
}

Assistant:

void Resource::overrideGroup(const Containers::StringView group, const Containers::StringView configurationFile) {
    if(!resourceGlobals.overrideGroups) {
        static std::map<Containers::StringView, Containers::String> overrideGroups;
        resourceGlobals.overrideGroups = &overrideGroups;
    }

    CORRADE_ASSERT(findGroup(group),
        "Utility::Resource::overrideGroup(): group '" << Debug::nospace << group << Debug::nospace << "' was not found", );
    /* This group can be already overridden from before, so insert if not there
       yet and then update the filename */
    resourceGlobals.overrideGroups->emplace(group, Containers::String{}).first->second = Containers::String::nullTerminatedGlobalView(configurationFile);
}